

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener_tests.cpp
# Opt level: O3

void __thiscall MyTestEventListener::~MyTestEventListener(MyTestEventListener *this)

{
  operator_delete(this,0x18);
  return;
}

Assistant:

class MyTestEventListener IUTEST_CXX_FINAL : public ::iuutil::backward::TestEventListener
{
public:
    bool called_OnTestProgramStart;
    bool called_OnTestIterationStart;
    bool called_OnEnvironmentsSetUpStart;
    bool called_OnEnvironmentsSetUpEnd;
    bool called_OnTestSuiteStart;
    bool called_OnTestStart;
    bool called_OnTestPartResult;
    bool called_OnTestRecordProperty;
    bool called_OnTestEnd;
    bool called_OnTestSuiteEnd;
    bool called_OnEnvironmentsTearDownStart;
    bool called_OnEnvironmentsTearDownEnd;
    bool called_OnTestIterationEnd;
    bool called_OnTestProgramEnd;

public:
    MyTestEventListener(void)
    : called_OnTestProgramStart(false)
    , called_OnTestIterationStart(false)
    , called_OnEnvironmentsSetUpStart(false)
    , called_OnEnvironmentsSetUpEnd(false)
    , called_OnTestSuiteStart(false)
    , called_OnTestStart(false)
    , called_OnTestPartResult(false)
    , called_OnTestRecordProperty(false)
    , called_OnTestEnd(false)
    , called_OnTestSuiteEnd(false)
    , called_OnEnvironmentsTearDownStart(false)
    , called_OnEnvironmentsTearDownEnd(false)
    , called_OnTestIterationEnd(false)
    , called_OnTestProgramEnd(false)
    {}

public:
    virtual void OnTestProgramStart(const ::iutest::UnitTest& /*test*/) IUTEST_CXX_OVERRIDE
    {
        called_OnTestProgramStart = true;
    }